

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O3

void __thiscall katherine::system_error::system_error(system_error *this,int rc)

{
  char *__s;
  allocator<char> local_31;
  long *local_30 [2];
  long local_20 [2];
  
  __s = strerror(rc);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,__s,&local_31);
  std::runtime_error::runtime_error((runtime_error *)this,(string *)local_30);
  *(undefined ***)&this->super_error = &PTR__runtime_error_00105d70;
  if (local_30[0] != local_20) {
    operator_delete(local_30[0],local_20[0] + 1);
  }
  *(undefined ***)&this->super_error = &PTR__runtime_error_00105d48;
  return;
}

Assistant:

system_error(int rc) :error{std::strerror(rc)} { }